

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O0

int __thiscall PPSUnit::deserialize(PPSUnit *this)

{
  bool bVar1;
  uint uVar2;
  uint8_t *end;
  BitStreamException *e;
  int rez;
  uint8_t *nalEnd;
  PPSUnit *this_local;
  
  end = (this->super_NALUnit).m_nalBuffer + (this->super_NALUnit).m_nalBufferLen;
  this_local._4_4_ =
       NALUnit::deserialize(&this->super_NALUnit,(this->super_NALUnit).m_nalBuffer,end);
  if (this_local._4_4_ == 0) {
    if ((long)end - (long)(this->super_NALUnit).m_nalBuffer < 2) {
      this_local._4_4_ = -10;
    }
    else {
      BitStreamReader::setBuffer
                (&(this->super_NALUnit).bitReader,(this->super_NALUnit).m_nalBuffer + 1,end);
      uVar2 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
      this->pic_parameter_set_id = uVar2;
      if (this->pic_parameter_set_id < 0x100) {
        uVar2 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
        this->seq_parameter_set_id = uVar2;
        if (this->seq_parameter_set_id < 0x20) {
          bVar1 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
          this->entropy_coding_mode_flag = (uint)bVar1;
          bVar1 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
          this->pic_order_present_flag = (uint)bVar1;
          this->m_ready = true;
          this_local._4_4_ = 0;
        }
        else {
          this_local._4_4_ = 1;
        }
      }
      else {
        this_local._4_4_ = 1;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int PPSUnit::deserialize()
{
    uint8_t* nalEnd = m_nalBuffer + m_nalBufferLen;
    const int rez = NALUnit::deserialize(m_nalBuffer, nalEnd);
    if (rez != 0)
        return rez;
    if (nalEnd - m_nalBuffer < 2)
        return NOT_ENOUGH_BUFFER;
    try
    {
        bitReader.setBuffer(m_nalBuffer + 1, nalEnd);
        pic_parameter_set_id = extractUEGolombCode();
        if (pic_parameter_set_id >= 256)
            return 1;
        seq_parameter_set_id = extractUEGolombCode();
        if (seq_parameter_set_id >= 32)
            return 1;
        entropy_coding_mode_flag = bitReader.getBit();
        pic_order_present_flag = bitReader.getBit();

        m_ready = true;
        return 0;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}